

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O0

bool __thiscall Imf_2_5::InputFile::isComplete(InputFile *this)

{
  long in_RDI;
  undefined1 local_1;
  
  if (*(long *)(*(long *)(in_RDI + 8) + 0x78) == 0) {
    if ((*(byte *)(*(long *)(in_RDI + 8) + 100) & 1) == 0) {
      local_1 = ScanLineInputFile::isComplete(*(ScanLineInputFile **)(*(long *)(in_RDI + 8) + 0x70))
      ;
    }
    else {
      local_1 = TiledInputFile::isComplete(*(TiledInputFile **)(*(long *)(in_RDI + 8) + 0x68));
    }
  }
  else {
    local_1 = DeepScanLineInputFile::isComplete
                        (*(DeepScanLineInputFile **)(*(long *)(in_RDI + 8) + 0x78));
  }
  return local_1;
}

Assistant:

bool
InputFile::isComplete () const
{
    if (_data->dsFile)
        return _data->dsFile->isComplete();
    else if (_data->isTiled)
	return _data->tFile->isComplete();
    else
	return _data->sFile->isComplete();
}